

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_BonusTiles_Test::testBody(TEST_WiningStateTest_BonusTiles_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  WiningState *this_00;
  unsigned_long in_stack_fffffffffffffde8;
  undefined4 uVar8;
  undefined8 uVar6;
  NormalTestTerminator *pNVar7;
  int iVar9;
  NormalTestTerminator local_128;
  NormalTestTerminator local_120;
  SimpleString local_118;
  SimpleString local_110;
  NormalTestTerminator local_108;
  NormalTestTerminator local_100;
  SimpleString local_f8;
  SimpleString local_f0;
  NormalTestTerminator local_e8;
  NormalTestTerminator local_e0;
  key_type local_d4;
  SimpleString local_d0;
  SimpleString local_c8;
  key_type local_bc [6];
  key_type local_a4;
  undefined1 local_a0 [8];
  DoublingFactorReport r;
  TEST_WiningStateTest_BonusTiles_Test *this_local;
  
  TEST_GROUP_CppUTestGroupWiningStateTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,OneOfBamboos);
  TEST_GROUP_CppUTestGroupWiningStateTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,TwoOfBamboos);
  TEST_GROUP_CppUTestGroupWiningStateTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,ThreeOfCharacters);
  TEST_GROUP_CppUTestGroupWiningStateTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,SixOfCircles);
  TEST_GROUP_CppUTestGroupWiningStateTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,SevenOfCharacters);
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s;
  mahjong::WiningState::addBonusTile(this_00,OneOfBamboos);
  mahjong::WiningState::addBonusTile(this_00,SixOfCircles);
  mahjong::WiningState::addBonusTile(this_00,NineOfCharacters);
  r.doubling_factor = 0;
  TEST_GROUP_CppUTestGroupWiningStateTest::selfDrawn
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,(SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a0,
             &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c);
  local_a4 = SelfDrawn;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_a4);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_e8;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xe8);
    iVar9 = (int)((ulong)pNVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e1d2e);
  }
  else {
    local_bc[1] = 8;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc + 1);
    local_bc[0] = SelfDrawn;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                 ,0xe8);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffde8 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d4 = SelfDrawn;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_d4);
    StringFrom(in_stack_fffffffffffffde8);
    uVar8 = (undefined4)(in_stack_fffffffffffffde8 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d0);
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e0);
    uVar6 = CONCAT44(uVar8,0xe8);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,uVar6,&local_e0);
    iVar9 = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e1c42);
    SimpleString::~SimpleString((SimpleString *)0x1e1c4e);
    SimpleString::~SimpleString((SimpleString *)0x1e1c5a);
  }
  if ((int)r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count == 6) {
    pUVar3 = UtestShell::getCurrent();
    local_108.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_108;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xe9);
    iVar9 = (int)((ulong)pNVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e1f5b);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(iVar9);
    pcVar4 = SimpleString::asCharString(&local_f0);
    StringFrom(iVar9);
    pcVar5 = SimpleString::asCharString(&local_f8);
    local_100.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_100);
    uVar6 = CONCAT44(iVar9,0xe9);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,uVar6,&local_100);
    iVar9 = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e1e6f);
    SimpleString::~SimpleString((SimpleString *)0x1e1e7b);
    SimpleString::~SimpleString((SimpleString *)0x1e1e87);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 7) {
    pUVar3 = UtestShell::getCurrent();
    local_128.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_128);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xea,&local_128);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e2188);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(iVar9);
    pcVar4 = SimpleString::asCharString(&local_110);
    StringFrom(iVar9);
    pcVar5 = SimpleString::asCharString(&local_118);
    local_120.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_120);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,CONCAT44(iVar9,0xea),&local_120);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e209c);
    SimpleString::~SimpleString((SimpleString *)0x1e20a8);
    SimpleString::~SimpleString((SimpleString *)0x1e20b4);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a0);
  return;
}

Assistant:

TEST(WiningStateTest, BonusTiles)
{
	addPair(Tile::OneOfBamboos);
	addSequence(Tile::TwoOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::SixOfCircles);
	s.addBonusTile(Tile::NineOfCharacters);

	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(6, r.bonus_tile_count);
	CHECK_EQUAL(7, r.doubling_factor);
}